

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_e668::AudioState::handler(AudioState *this)

{
  SwrContextPtr *this_00;
  uint8_t **ppuVar1;
  __atomic_flag_data_type _Var2;
  AVSampleFormat AVar3;
  undefined4 uVar4;
  uint uVar5;
  uint64_t uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  code *pcVar10;
  char cVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  pointer __p;
  uint64_t uVar17;
  AVCodecContext *pAVar18;
  pointer pSVar19;
  pointer pdVar20;
  ostream *poVar21;
  pointer __p_00;
  undefined8 uVar22;
  long lVar23;
  __int_type_conflict __n;
  void *pvVar24;
  size_t sVar25;
  ptrdiff_t _Num;
  ulong uVar26;
  uint8_t *puVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  char *pcVar31;
  long lVar32;
  ALuint *pAVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ALint processed;
  vector<double,_std::allocator<double>_> mtx;
  ALint queued;
  ALuint *local_80;
  ALenum state;
  void *local_70;
  void *samples;
  milliseconds sleep_time;
  unique_lock<std::mutex> srclock;
  array<int,_3UL> evt_types;
  
  srclock._M_device = &this->mSrcMutex;
  srclock._M_owns = false;
  sleep_time.__r = 6;
  evt_types._M_elems[0] = 0x19a4;
  evt_types._M_elems[1] = 0x19a5;
  evt_types._M_elems[2] = 0x19a6;
  if ((anonymous_namespace)::alEventControlSOFT != (code *)0x0) {
    (*(anonymous_namespace)::alEventControlSOFT)(3,&evt_types,1);
    (*(anonymous_namespace)::alEventCallbackSOFT)(EventCallback,this);
    sleep_time.__r = 800;
  }
  cVar11 = alIsExtensionPresent("AL_SOFT_bformat_ex");
  this->mDstChanLayout = 0;
  this->mFormat = 0;
  AVar3 = ((this->mCodecCtx)._M_t.
           super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
           super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
           super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_fmt;
  if (((AVar3 == AV_SAMPLE_FMT_FLTP) || (AVar3 == AV_SAMPLE_FMT_FLT)) &&
     (cVar12 = alIsExtensionPresent("AL_EXT_FLOAT32"), cVar12 != '\0')) {
    this->mDstSampleFmt = AV_SAMPLE_FMT_FLT;
    this->mFrameSize = 4;
    pAVar18 = (this->mCodecCtx)._M_t.
              super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
              super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
    if (pAVar18->channel_layout == 0x63f) {
      cVar12 = alIsExtensionPresent("AL_EXT_MCFORMATS");
      if (cVar12 == '\0') {
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
      }
      else {
        iVar13 = alGetEnumValue("AL_FORMAT_71CHN32");
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
        if (iVar13 - 1U < 0xfffffffe) {
          this->mDstChanLayout = pAVar18->channel_layout;
          this->mFrameSize = this->mFrameSize << 3;
          this->mFormat = iVar13;
        }
      }
    }
    if ((pAVar18->channel_layout == 0x60f) || (pAVar18->channel_layout == 0x3f)) {
      cVar12 = alIsExtensionPresent("AL_EXT_MCFORMATS");
      if (cVar12 == '\0') {
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
      }
      else {
        iVar13 = alGetEnumValue("AL_FORMAT_51CHN32");
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
        if (iVar13 - 1U < 0xfffffffe) {
          this->mDstChanLayout = pAVar18->channel_layout;
          this->mFrameSize = this->mFrameSize * 6;
          this->mFormat = iVar13;
        }
      }
    }
    if (pAVar18->channel_layout == 0) {
      if (((pAVar18->channels < 4) ||
          (cVar12 = alIsExtensionPresent("AL_EXT_BFORMAT"), cVar12 == '\0')) ||
         ((iVar13 = alGetEnumValue("AL_FORMAT_BFORMAT3D_FLOAT32"), 0xfffffffd < iVar13 - 1U ||
          (uVar28 = ((this->mCodecCtx)._M_t.
                     super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                     .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->channels,
          uVar29 = (int)SQRT((double)(int)uVar28) * (int)SQRT((double)(int)uVar28),
          (uVar29 | 2) != uVar28 && uVar29 != uVar28)))) goto LAB_00107d53;
      this->mFrameSize = this->mFrameSize << 2;
    }
    else if (pAVar18->channel_layout == 4) {
      this->mDstChanLayout = 4;
      iVar13 = 0x10010;
    }
    else {
LAB_00107d53:
      if (this->mFormat != 0) goto LAB_00107d78;
      this->mDstChanLayout = 3;
      this->mFrameSize = this->mFrameSize << 1;
      iVar13 = 0x10011;
    }
    this->mFormat = iVar13;
  }
LAB_00107d78:
  pAVar18 = (this->mCodecCtx)._M_t.
            super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
            super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
            super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
  if ((pAVar18->sample_fmt == AV_SAMPLE_FMT_U8P) || (pAVar18->sample_fmt == AV_SAMPLE_FMT_U8)) {
    this->mDstSampleFmt = AV_SAMPLE_FMT_U8;
    this->mFrameSize = 1;
    if (pAVar18->channel_layout == 0x63f) {
      cVar12 = alIsExtensionPresent("AL_EXT_MCFORMATS");
      if (cVar12 == '\0') {
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
      }
      else {
        iVar13 = alGetEnumValue("AL_FORMAT_71CHN8");
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
        if (iVar13 - 1U < 0xfffffffe) {
          this->mDstChanLayout = pAVar18->channel_layout;
          this->mFrameSize = this->mFrameSize << 3;
          this->mFormat = iVar13;
        }
      }
    }
    if ((pAVar18->channel_layout == 0x60f) || (pAVar18->channel_layout == 0x3f)) {
      cVar12 = alIsExtensionPresent("AL_EXT_MCFORMATS");
      if (cVar12 == '\0') {
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
      }
      else {
        iVar13 = alGetEnumValue("AL_FORMAT_51CHN8");
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
        if (iVar13 - 1U < 0xfffffffe) {
          this->mDstChanLayout = pAVar18->channel_layout;
          this->mFrameSize = this->mFrameSize * 6;
          this->mFormat = iVar13;
        }
      }
    }
    if (pAVar18->channel_layout == 0) {
      if ((((pAVar18->channels < 4) ||
           (cVar12 = alIsExtensionPresent("AL_EXT_BFORMAT"), cVar12 == '\0')) ||
          (iVar13 = alGetEnumValue("AL_FORMAT_BFORMAT3D8"), 0xfffffffd < iVar13 - 1U)) ||
         (uVar28 = ((this->mCodecCtx)._M_t.
                    super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                    _M_t.
                    super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                    .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->channels,
         uVar29 = (int)SQRT((double)(int)uVar28) * (int)SQRT((double)(int)uVar28),
         (uVar29 | 2) != uVar28 && uVar29 != uVar28)) goto LAB_00107f76;
LAB_00107f6a:
      this->mFrameSize = this->mFrameSize << 2;
    }
    else if (pAVar18->channel_layout == 4) {
      this->mDstChanLayout = 4;
      iVar13 = 0x1100;
    }
    else {
LAB_00107f76:
      if (this->mFormat != 0) goto LAB_001080af;
      this->mDstChanLayout = 3;
      this->mFrameSize = this->mFrameSize << 1;
      iVar13 = 0x1102;
    }
LAB_001080a9:
    this->mFormat = iVar13;
  }
  else if (this->mFormat == 0) {
    this->mDstSampleFmt = AV_SAMPLE_FMT_S16;
    this->mFrameSize = 2;
    if (pAVar18->channel_layout == 0x63f) {
      cVar12 = alIsExtensionPresent("AL_EXT_MCFORMATS");
      if (cVar12 == '\0') {
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
      }
      else {
        iVar13 = alGetEnumValue("AL_FORMAT_71CHN16");
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
        if (iVar13 - 1U < 0xfffffffe) {
          this->mDstChanLayout = pAVar18->channel_layout;
          this->mFrameSize = this->mFrameSize << 3;
          this->mFormat = iVar13;
        }
      }
    }
    if ((pAVar18->channel_layout == 0x60f) || (pAVar18->channel_layout == 0x3f)) {
      cVar12 = alIsExtensionPresent("AL_EXT_MCFORMATS");
      if (cVar12 == '\0') {
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
      }
      else {
        iVar13 = alGetEnumValue("AL_FORMAT_51CHN16");
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
        if (iVar13 - 1U < 0xfffffffe) {
          this->mDstChanLayout = pAVar18->channel_layout;
          this->mFrameSize = this->mFrameSize * 6;
          this->mFormat = iVar13;
        }
      }
    }
    if (pAVar18->channel_layout == 0) {
      if (((3 < pAVar18->channels) &&
          (cVar12 = alIsExtensionPresent("AL_EXT_BFORMAT"), cVar12 != '\0')) &&
         ((iVar13 = alGetEnumValue("AL_FORMAT_BFORMAT3D16"), iVar13 - 1U < 0xfffffffe &&
          (uVar28 = ((this->mCodecCtx)._M_t.
                     super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                     .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->channels,
          uVar29 = (int)SQRT((double)(int)uVar28) * (int)SQRT((double)(int)uVar28),
          (uVar29 | 2) == uVar28 || uVar29 == uVar28)))) goto LAB_00107f6a;
    }
    else if (pAVar18->channel_layout == 4) {
      this->mDstChanLayout = 4;
      iVar13 = 0x1101;
      goto LAB_001080a9;
    }
    if (this->mFormat == 0) {
      this->mDstChanLayout = 3;
      this->mFrameSize = this->mFrameSize << 1;
      iVar13 = 0x1103;
      goto LAB_001080a9;
    }
  }
LAB_001080af:
  samples = (void *)0x0;
  this->mSamples = (uint8_t *)0x0;
  this->mSamplesLen = 0;
  this->mSamplesPos = 0;
  this->mSamplesMax = 0;
  __p = (pointer)av_frame_alloc();
  std::__uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::reset
            ((__uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)&this->mDecodedFrame
             ,__p);
  if ((this->mDecodedFrame)._M_t.
      super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
      super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
      super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl == (AVFrame *)0x0) {
    pcVar31 = "Failed to allocate audio frame";
  }
  else {
    pAVar18 = (this->mCodecCtx)._M_t.
              super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
              super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
    uVar6 = this->mDstChanLayout;
    this_00 = &this->mSwresCtx;
    AVar3 = this->mDstSampleFmt;
    iVar13 = pAVar18->sample_rate;
    if (uVar6 == 0) {
      pSVar19 = (pointer)swr_alloc_set_opts(0,0xf,AVar3,iVar13,
                                            ~(-1L << ((byte)pAVar18->channels & 0x3f)),
                                            pAVar18->sample_fmt,iVar13,0,0);
      std::unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter>::reset(this_00,pSVar19);
      _state = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&mtx,0x1000,(value_type_conflict2 *)&state,(allocator_type *)&processed);
      if (cVar11 == '\0') {
        poVar21 = std::operator<<((ostream *)&std::cout,"Found AL_EXT_BFORMAT");
        std::endl<char,std::char_traits<char>>(poVar21);
        *mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start = 0.7071067811865476;
        mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[0x43] = 1.0;
        mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[0x81] = 1.0;
        pdVar20 = mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 0xc2;
      }
      else {
        poVar21 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_bformat_ex");
        std::endl<char,std::char_traits<char>>(poVar21);
        *mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start = 1.0;
        mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[0x41] = 1.0;
        mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[0x82] = 1.0;
        pdVar20 = mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 0xc3;
      }
      *pdVar20 = 1.0;
      swr_set_matrix((this_00->_M_t).
                     super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>.
                     _M_t.
                     super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>.
                     super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl,
                     mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,0x40);
      uVar22 = 1;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&mtx.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      uVar17 = pAVar18->channel_layout;
      iVar14 = iVar13;
      if (uVar17 == 0) {
        uVar17 = av_get_default_channel_layout(pAVar18->channels);
        pAVar18 = (this->mCodecCtx)._M_t.
                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                  .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
        iVar14 = pAVar18->sample_rate;
      }
      uVar22 = 0;
      pSVar19 = (pointer)swr_alloc_set_opts(0,uVar6,AVar3,iVar13,uVar17,pAVar18->sample_fmt,iVar14,0
                                            ,0);
      std::unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter>::reset(this_00,pSVar19);
    }
    pcVar31 = "Failed to initialize audio converter";
    if (((this->mSwresCtx)._M_t.
         super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>._M_t.
         super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>.
         super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl != (SwrContext *)0x0) &&
       (iVar13 = swr_init(), iVar13 == 0)) {
      alGenBuffers(0x28,&this->mBuffers);
      pAVar33 = &this->mSource;
      alGenSources(1,pAVar33);
      if ((anonymous_namespace)::DirectOutMode != 0) {
        alSourcei(*pAVar33,0x1033);
      }
      if ((anonymous_namespace)::EnableWideStereo == '\x01') {
        mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0xbf860a923f860a92;
        alSourcefv(*pAVar33,0x1030);
      }
      local_80 = pAVar33;
      if (cVar11 != '\0') {
        for (lVar32 = -0xa0; lVar32 != 0; lVar32 = lVar32 + 4) {
          uVar4 = *(undefined4 *)((long)&this->mBufferIdx + lVar32);
          alBufferi(uVar4,0x1997,uVar22);
          alBufferi(uVar4,0x1998,uVar22);
        }
      }
      iVar13 = alGetError();
      pAVar33 = local_80;
      if (iVar13 != 0) goto LAB_001082b8;
      if ((anonymous_namespace)::alBufferCallbackSOFT == (code *)0x0) {
LAB_001084d4:
        uVar28 = (((this->mCodecCtx)._M_t.
                   super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                   .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate / 0x32
                 ) * this->mFrameSize;
        if (0 < (int)uVar28) {
          samples = (void *)av_malloc(uVar28);
        }
      }
      else {
        (*(anonymous_namespace)::alBufferCallbackSOFT)
                  ((this->mBuffers)._M_elems[0],this->mFormat,
                   ((this->mCodecCtx)._M_t.
                    super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                    _M_t.
                    super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                    .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate,
                   bufferCallbackC,this,0);
        alSourcei(*pAVar33,0x1009,(this->mBuffers)._M_elems[0]);
        iVar13 = alGetError();
        if (iVar13 != 0) {
          fwrite("Failed to set buffer callback\n",0x1e,1,_stderr);
          alSourcei(*pAVar33,0x1009,0);
          goto LAB_001084d4;
        }
        uVar26 = (ulong)this->mFrameSize *
                 (((long)((this->mCodecCtx)._M_t.
                          super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                          .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate
                  * 800) / 1000);
        this->mBufferDataSize = uVar26;
        __p_00 = (pointer)operator_new__(uVar26);
        std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
                  ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
                   &this->mBufferData,__p_00);
        (this->mReadPos).super___atomic_base<unsigned_long>._M_i = 0;
        (this->mWritePos).super___atomic_base<unsigned_long>._M_i = 0;
        mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((ulong)mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start & 0xffffffff00000000);
        uVar22 = alcGetCurrentContext();
        uVar22 = alcGetContextsDevice(uVar22);
        alcGetIntegerv(uVar22,0x1008,1,&mtx);
        uVar28 = 0;
        sleep_time.__r =
             (rep)(int)(1000 / (long)(int)mtx.super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
      }
      ppuVar1 = &this->mSamples;
      do {
        iVar13 = PacketQueue<2097152UL>::sendTo
                           (&this->mPackets,
                            (this->mCodecCtx)._M_t.
                            super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                            .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl);
        if (iVar13 == -0x20464f45) break;
      } while (iVar13 != -0xb);
      std::unique_lock<std::mutex>::lock(&srclock);
      pcVar10 = (anonymous_namespace)::alcGetInteger64vSOFT;
      if ((anonymous_namespace)::alcGetInteger64vSOFT != (code *)0x0) {
        mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        uVar22 = alcGetCurrentContext();
        uVar22 = alcGetContextsDevice(uVar22);
        (*pcVar10)(uVar22,0x1600,1,&mtx);
        (this->mDeviceStartTime).__r =
             (long)mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start - (this->mCurrentPts).__r;
      }
      iVar13 = decodeFrame(this);
      pAVar33 = local_80;
      this->mSamplesLen = iVar13;
      if (0 < iVar13) {
        iVar14 = getSync(this);
        iVar13 = this->mSamplesLen;
        if (iVar14 < this->mSamplesLen) {
          iVar13 = iVar14;
        }
        this->mSamplesPos = iVar13;
        lVar32 = ((long)iVar13 * 1000000000) /
                 (long)((this->mCodecCtx)._M_t.
                        super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                        .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate;
        (this->mDeviceStartTime).__r = (this->mDeviceStartTime).__r - lVar32;
        (this->mCurrentPts).__r = (this->mCurrentPts).__r + lVar32;
      }
      while (((this->mMovie->mQuit)._M_base._M_i & 1U) == 0) {
        LOCK();
        _Var2 = (this->mConnected).super___atomic_flag_base._M_i;
        (this->mConnected).super___atomic_flag_base._M_i = true;
        UNLOCK();
        if (_Var2 == false) break;
        if (this->mBufferDataSize == 0) {
          alGetSourcei(*pAVar33,0x1016,&processed);
          for (; 0 < processed; processed = processed + -1) {
            alSourceUnqueueBuffers(*pAVar33,1,&mtx);
          }
          iVar13 = getSync(this);
          alGetSourcei(*pAVar33,0x1015,&queued);
          for (; (uint)queued < 0x28; queued = queued + 1) {
            uVar34 = 0;
            uVar29 = uVar28 / this->mFrameSize;
            local_70 = samples;
            puVar27 = (uint8_t *)samples;
            while ((pAVar33 = local_80, 0 < this->mSamplesLen &&
                   (uVar16 = uVar29 - uVar34, uVar34 <= uVar29 && uVar16 != 0))) {
              iVar14 = this->mSamplesPos;
              uVar5 = this->mFrameSize;
              uVar26 = (ulong)uVar5;
              if (iVar14 < 0) {
                uVar30 = -iVar14;
                if (uVar16 < (uint)-iVar14) {
                  uVar30 = uVar16;
                }
                uVar35 = (ulong)uVar30;
                if ((uVar5 & 7) == 0) {
                  sample_dup<unsigned_long>(puVar27,*ppuVar1,uVar35,uVar26);
                }
                else if ((uVar5 & 3) == 0) {
                  sample_dup<unsigned_int>(puVar27,*ppuVar1,uVar35,uVar26);
                }
                else if ((uVar5 & 1) == 0) {
                  sample_dup<unsigned_short>(puVar27,*ppuVar1,uVar35,uVar26);
                }
                else {
                  sample_dup<unsigned_char>(puVar27,*ppuVar1,uVar35,uVar26);
                }
              }
              else {
                uVar30 = this->mSamplesLen - iVar14;
                if (uVar16 < uVar30) {
                  uVar30 = uVar16;
                }
                if (uVar30 * uVar5 != 0) {
                  memmove(puVar27,*ppuVar1 + iVar14 * uVar5,(ulong)(uVar30 * uVar5));
                }
              }
              iVar15 = this->mSamplesPos + uVar30;
              this->mSamplesPos = iVar15;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = (ulong)uVar30 * 1000000000;
              (this->mCurrentPts).__r =
                   (this->mCurrentPts).__r +
                   SUB168(auVar8 / SEXT816((long)((this->mCodecCtx)._M_t.
                                                  super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                                                  .super__Head_base<0UL,_AVCodecContext_*,_false>.
                                                 _M_head_impl)->sample_rate),0);
              puVar27 = puVar27 + this->mFrameSize * uVar30;
              uVar34 = uVar34 + uVar30;
              iVar14 = this->mSamplesLen;
              while ((iVar14 <= iVar15 && (iVar14 = decodeFrame(this), 0 < iVar14))) {
                this->mSamplesLen = iVar14;
                iVar15 = iVar14;
                if (iVar13 < iVar14) {
                  iVar15 = iVar13;
                }
                this->mSamplesPos = iVar15;
                lVar32 = ((long)iVar15 * 1000000000) /
                         (long)((this->mCodecCtx)._M_t.
                                super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                                .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->
                               sample_rate;
                (this->mDeviceStartTime).__r = (this->mDeviceStartTime).__r - lVar32;
                iVar13 = iVar13 - iVar15;
                (this->mCurrentPts).__r = (this->mCurrentPts).__r + lVar32;
              }
            }
            if ((uVar34 == 0) || (uVar16 = uVar29 - uVar34, uVar29 < uVar34 || uVar16 == 0)) {
              if (uVar34 == 0) break;
              pAVar18 = (this->mCodecCtx)._M_t.
                        super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                        .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
            }
            else {
              mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)(this->mDstSampleFmt == AV_SAMPLE_FMT_U8) << 7);
              std::__fill_n_a<unsigned_char*,unsigned_int,int>
                        (puVar27,this->mFrameSize * uVar16,&mtx);
              pAVar18 = (this->mCodecCtx)._M_t.
                        super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                        .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = (ulong)uVar16 * 1000000000;
              (this->mCurrentPts).__r =
                   (this->mCurrentPts).__r + SUB168(auVar9 / SEXT816((long)pAVar18->sample_rate),0);
            }
            uVar29 = (this->mBuffers)._M_elems[this->mBufferIdx];
            mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(mtx.super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,uVar29);
            this->mBufferIdx = (this->mBufferIdx + 1) % 0x28;
            alBufferData(uVar29,this->mFormat,local_70,uVar28,pAVar18->sample_rate);
            alSourceQueueBuffers(*pAVar33,1,&mtx);
          }
          alGetSourcei(*pAVar33,0x1010,&state);
          if (state != 0x1014) goto LAB_00108bd0;
          alSourceRewind(*pAVar33);
          alSourcei(*pAVar33,0x1009,0);
          pcVar10 = (anonymous_namespace)::alcGetInteger64vSOFT;
          pAVar33 = local_80;
          if ((anonymous_namespace)::alcGetInteger64vSOFT != (code *)0x0) {
            mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            uVar22 = alcGetCurrentContext();
            uVar22 = alcGetContextsDevice(uVar22);
            (*pcVar10)(uVar22,0x1600,1,&mtx);
            (this->mDeviceStartTime).__r =
                 (long)mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start - (this->mCurrentPts).__r;
            pAVar33 = local_80;
          }
        }
        else {
          alGetSourcei(*pAVar33,0x1010,&state);
          iVar13 = getSync(this);
          __n = (this->mWritePos).super___atomic_base<unsigned_long>._M_i;
LAB_0010863f:
          if (0 < (long)this->mSamplesLen) {
            uVar26 = (this->mReadPos).super___atomic_base<unsigned_long>._M_i;
            lVar32 = (long)this->mSamplesPos;
            if (lVar32 < 0) {
              if (__n < uVar26) {
                lVar32 = uVar26 - 1;
              }
              else {
                lVar32 = this->mBufferDataSize - (ulong)(uVar26 == 0);
              }
              uVar29 = this->mFrameSize;
              uVar35 = (ulong)uVar29;
              uVar26 = (lVar32 - __n) / uVar35;
              uVar36 = (ulong)(uint)-this->mSamplesPos;
              if (uVar36 <= uVar26) {
                uVar26 = uVar36;
              }
              if (lVar32 - __n < uVar35) goto LAB_0010889e;
              puVar27 = (this->mBufferData)._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + __n;
              if ((uVar29 & 7) == 0) {
                sample_dup<unsigned_long>(puVar27,*ppuVar1,uVar26,uVar35);
              }
              else if ((uVar29 & 3) == 0) {
                sample_dup<unsigned_int>(puVar27,*ppuVar1,uVar26,uVar35);
              }
              else if ((uVar29 & 1) == 0) {
                sample_dup<unsigned_short>(puVar27,*ppuVar1,uVar26,uVar35);
              }
              else {
                sample_dup<unsigned_char>(puVar27,*ppuVar1,uVar26,uVar35);
              }
              __n = this->mFrameSize * uVar26 + __n;
              if (__n == this->mBufferDataSize) {
                __n = 0;
              }
              (this->mWritePos).super___atomic_base<unsigned_long>._M_i = __n;
              this->mSamplesPos = this->mSamplesPos + (int)uVar26;
              (this->mCurrentPts).__r =
                   (this->mCurrentPts).__r +
                   (long)(uVar26 * 1000000000) /
                   (long)((this->mCodecCtx)._M_t.
                          super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                          .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate
              ;
            }
            else {
              uVar35 = (this->mSamplesLen - lVar32) * (ulong)this->mFrameSize;
              pvVar24 = (void *)((ulong)this->mFrameSize * lVar32);
              if (__n < uVar26) {
                if (uVar26 + ~__n < uVar35) goto LAB_0010889e;
                memcpy((this->mBufferData)._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + __n,
                       (uint8_t *)((long)pvVar24 + (long)this->mSamples),uVar35);
                __n = __n + uVar35;
              }
              else {
                if (uVar26 + ~__n + this->mBufferDataSize < uVar35) goto LAB_0010889e;
                uVar26 = this->mBufferDataSize - __n;
                if (uVar35 <= uVar26) {
                  uVar26 = uVar35;
                }
                local_70 = pvVar24;
                memcpy((this->mBufferData)._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + __n,
                       this->mSamples + (long)pvVar24,uVar26);
                __n = __n + uVar26;
                if (__n == this->mBufferDataSize) {
                  __n = uVar35 - uVar26;
                  if (__n == 0) {
                    __n = 0;
                  }
                  else {
                    memcpy((this->mBufferData)._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                           (uint8_t *)((long)local_70 + (long)this->mSamples) + uVar26,__n);
                  }
                }
              }
              (this->mWritePos).super___atomic_base<unsigned_long>._M_i = __n;
              (this->mCurrentPts).__r =
                   (this->mCurrentPts).__r +
                   (((long)this->mSamplesLen - (long)this->mSamplesPos) * 1000000000) /
                   (long)((this->mCodecCtx)._M_t.
                          super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                          .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate
              ;
              iVar14 = iVar13;
              do {
                iVar15 = decodeFrame(this);
                this->mSamplesLen = iVar15;
                iVar13 = iVar14;
                if (iVar15 < 1) break;
                iVar13 = iVar15;
                if (iVar14 < iVar15) {
                  iVar13 = iVar14;
                }
                this->mSamplesPos = iVar13;
                lVar32 = ((long)iVar13 * 1000000000) /
                         (long)((this->mCodecCtx)._M_t.
                                super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                                .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->
                               sample_rate;
                (this->mDeviceStartTime).__r = (this->mDeviceStartTime).__r - lVar32;
                (this->mCurrentPts).__r = (this->mCurrentPts).__r + lVar32;
                iVar13 = iVar14 - iVar13;
                bVar7 = iVar15 <= iVar14;
                iVar14 = iVar13;
              } while (bVar7);
            }
            goto LAB_0010863f;
          }
LAB_0010889e:
LAB_00108bd0:
          if (state - 0x1014U < 0xfffffffe) {
            uVar26 = (this->mWritePos).super___atomic_base<unsigned_long>._M_i;
            uVar35 = (this->mReadPos).super___atomic_base<unsigned_long>._M_i;
            sVar25 = 0;
            if (uVar26 < uVar35) {
              sVar25 = this->mBufferDataSize;
            }
            uVar26 = sVar25 + uVar26;
            uVar36 = uVar26 - uVar35;
            if (this->mBufferDataSize == 0) {
              mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start & 0xffffffff00000000);
              alGetSourcei(*pAVar33,0x1015,&mtx);
              if ((int)mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start == 0) break;
            }
            else {
              if (uVar26 == uVar35) break;
              if ((anonymous_namespace)::alcGetInteger64vSOFT == (code *)0x0) {
                (this->mDeviceStartTime).__r =
                     (this->mCurrentPts).__r -
                     (long)((uVar36 / this->mFrameSize) * 1000000000) /
                     (long)((this->mCodecCtx)._M_t.
                            super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                            .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->
                           sample_rate;
              }
            }
            alSourcePlay(*pAVar33);
            if ((anonymous_namespace)::alcGetInteger64vSOFT != (code *)0x0) {
              mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (*(anonymous_namespace)::alGetSourcei64vSOFT)(*pAVar33,0x1202,&mtx);
              lVar32 = (long)((this->mCodecCtx)._M_t.
                              super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                              .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->
                             sample_rate;
              if (this->mBufferDataSize == 0) {
                lVar23 = 800000000;
              }
              else {
                lVar23 = (long)((uVar36 / this->mFrameSize) * 1000000000) / lVar32;
              }
              (this->mDeviceStartTime).__r =
                   (long)mtx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                   (lVar23 - ((((long)mtx.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start * 0x1dcd65) /
                              0x800000) / lVar32 + (this->mCurrentPts).__r));
            }
          }
          iVar13 = alGetError();
          if (iVar13 != 0) goto LAB_001082e7;
          std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                    (&this->mSrcCond,&srclock,&sleep_time);
        }
      }
      alSourceRewind(*pAVar33);
      alSourcei(*pAVar33,0x1009,0);
      std::unique_lock<std::mutex>::unlock(&srclock);
      goto LAB_001082b8;
    }
  }
  poVar21 = std::operator<<((ostream *)&std::cerr,pcVar31);
  std::endl<char,std::char_traits<char>>(poVar21);
LAB_001082b8:
  av_freep(&samples);
  if ((anonymous_namespace)::alEventControlSOFT != (code *)0x0) {
    (*(anonymous_namespace)::alEventControlSOFT)(3,&evt_types,0);
    (*(anonymous_namespace)::alEventCallbackSOFT)(0,0);
  }
LAB_001082e7:
  std::unique_lock<std::mutex>::~unique_lock(&srclock);
  return 0;
}

Assistant:

int AudioState::handler()
{
    std::unique_lock<std::mutex> srclock{mSrcMutex, std::defer_lock};
    milliseconds sleep_time{AudioBufferTime / 3};
    ALenum fmt;

#ifdef AL_SOFT_events
    const std::array<ALenum,3> evt_types{{
        AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT, AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT,
        AL_EVENT_TYPE_DISCONNECTED_SOFT}};
    if(alEventControlSOFT)
    {
        alEventControlSOFT(evt_types.size(), evt_types.data(), AL_TRUE);
        alEventCallbackSOFT(EventCallback, this);
        sleep_time = AudioBufferTotalTime;
    }
#endif
#ifdef AL_SOFT_bformat_ex
    const bool has_bfmt_ex{alIsExtensionPresent("AL_SOFT_bformat_ex") != AL_FALSE};
    ALenum ambi_layout{AL_FUMA_SOFT};
    ALenum ambi_scale{AL_FUMA_SOFT};
#endif

    /* Find a suitable format for OpenAL. */
    mDstChanLayout = 0;
    mFormat = AL_NONE;
    if((mCodecCtx->sample_fmt == AV_SAMPLE_FMT_FLT || mCodecCtx->sample_fmt == AV_SAMPLE_FMT_FLTP) &&
       alIsExtensionPresent("AL_EXT_FLOAT32"))
    {
        mDstSampleFmt = AV_SAMPLE_FMT_FLT;
        mFrameSize = 4;
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_7POINT1 &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_71CHN32")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 8;
            mFormat = fmt;
        }
        if((mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1 ||
            mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1_BACK) &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_51CHN32")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 6;
            mFormat = fmt;
        }
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_MONO)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 1;
            mFormat = AL_FORMAT_MONO_FLOAT32;
        }
        /* Assume 3D B-Format (ambisonics) if the channel layout is blank and
         * there's 4 or more channels. FFmpeg/libavcodec otherwise seems to
         * have no way to specify if the source is actually B-Format (let alone
         * if it's 2D or 3D).
         */
        if(mCodecCtx->channel_layout == 0 && mCodecCtx->channels >= 4 &&
           alIsExtensionPresent("AL_EXT_BFORMAT") &&
           (fmt=alGetEnumValue("AL_FORMAT_BFORMAT3D_FLOAT32")) != AL_NONE && fmt != -1)
        {
            int order{static_cast<int>(std::sqrt(mCodecCtx->channels)) - 1};
            if((order+1)*(order+1) == mCodecCtx->channels ||
               (order+1)*(order+1) + 2 == mCodecCtx->channels)
            {
                /* OpenAL only supports first-order with AL_EXT_BFORMAT, which
                 * is 4 channels for 3D buffers.
                 */
                mFrameSize *= 4;
                mFormat = fmt;
            }
        }
        if(!mFormat)
        {
            mDstChanLayout = AV_CH_LAYOUT_STEREO;
            mFrameSize *= 2;
            mFormat = AL_FORMAT_STEREO_FLOAT32;
        }
    }
    if(mCodecCtx->sample_fmt == AV_SAMPLE_FMT_U8 || mCodecCtx->sample_fmt == AV_SAMPLE_FMT_U8P)
    {
        mDstSampleFmt = AV_SAMPLE_FMT_U8;
        mFrameSize = 1;
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_7POINT1 &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_71CHN8")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 8;
            mFormat = fmt;
        }
        if((mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1 ||
            mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1_BACK) &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_51CHN8")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 6;
            mFormat = fmt;
        }
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_MONO)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 1;
            mFormat = AL_FORMAT_MONO8;
        }
        if(mCodecCtx->channel_layout == 0 && mCodecCtx->channels >= 4 &&
           alIsExtensionPresent("AL_EXT_BFORMAT") &&
           (fmt=alGetEnumValue("AL_FORMAT_BFORMAT3D8")) != AL_NONE && fmt != -1)
        {
            int order{static_cast<int>(std::sqrt(mCodecCtx->channels)) - 1};
            if((order+1)*(order+1) == mCodecCtx->channels ||
               (order+1)*(order+1) + 2 == mCodecCtx->channels)
            {
                mFrameSize *= 4;
                mFormat = fmt;
            }
        }
        if(!mFormat)
        {
            mDstChanLayout = AV_CH_LAYOUT_STEREO;
            mFrameSize *= 2;
            mFormat = AL_FORMAT_STEREO8;
        }
    }
    if(!mFormat)
    {
        mDstSampleFmt = AV_SAMPLE_FMT_S16;
        mFrameSize = 2;
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_7POINT1 &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_71CHN16")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 8;
            mFormat = fmt;
        }
        if((mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1 ||
            mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1_BACK) &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_51CHN16")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 6;
            mFormat = fmt;
        }
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_MONO)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 1;
            mFormat = AL_FORMAT_MONO16;
        }
        if(mCodecCtx->channel_layout == 0 && mCodecCtx->channels >= 4 &&
           alIsExtensionPresent("AL_EXT_BFORMAT") &&
           (fmt=alGetEnumValue("AL_FORMAT_BFORMAT3D16")) != AL_NONE && fmt != -1)
        {
            int order{static_cast<int>(std::sqrt(mCodecCtx->channels)) - 1};
            if((order+1)*(order+1) == mCodecCtx->channels ||
               (order+1)*(order+1) + 2 == mCodecCtx->channels)
            {
                mFrameSize *= 4;
                mFormat = fmt;
            }
        }
        if(!mFormat)
        {
            mDstChanLayout = AV_CH_LAYOUT_STEREO;
            mFrameSize *= 2;
            mFormat = AL_FORMAT_STEREO16;
        }
    }
    void *samples{nullptr};
    ALsizei buffer_len{0};

    mSamples = nullptr;
    mSamplesMax = 0;
    mSamplesPos = 0;
    mSamplesLen = 0;

    mDecodedFrame.reset(av_frame_alloc());
    if(!mDecodedFrame)
    {
        std::cerr<< "Failed to allocate audio frame" <<std::endl;
        goto finish;
    }

    if(!mDstChanLayout)
    {
        /* OpenAL only supports first-order ambisonics with AL_EXT_BFORMAT, so
         * we have to drop any extra channels.
         */
        mSwresCtx.reset(swr_alloc_set_opts(nullptr,
            (1_i64<<4)-1, mDstSampleFmt, mCodecCtx->sample_rate,
            (1_i64<<mCodecCtx->channels)-1, mCodecCtx->sample_fmt, mCodecCtx->sample_rate,
            0, nullptr));

        /* Note that ffmpeg/libavcodec has no method to check the ambisonic
         * channel order and normalization, so we can only assume AmbiX as the
         * defacto-standard. This is not true for .amb files, which use FuMa.
         */
        std::vector<double> mtx(64*64, 0.0);
#ifdef AL_SOFT_bformat_ex
        ambi_layout = AL_ACN_SOFT;
        ambi_scale = AL_SN3D_SOFT;
        if(has_bfmt_ex)
        {
            /* An identity matrix that doesn't remix any channels. */
            std::cout<< "Found AL_SOFT_bformat_ex" <<std::endl;
            mtx[0 + 0*64] = 1.0;
            mtx[1 + 1*64] = 1.0;
            mtx[2 + 2*64] = 1.0;
            mtx[3 + 3*64] = 1.0;
        }
        else
#endif
        {
            std::cout<< "Found AL_EXT_BFORMAT" <<std::endl;
            /* Without AL_SOFT_bformat_ex, OpenAL only supports FuMa channel
             * ordering and normalization, so a custom matrix is needed to
             * scale and reorder the source from AmbiX.
             */
            mtx[0 + 0*64] = std::sqrt(0.5);
            mtx[3 + 1*64] = 1.0;
            mtx[1 + 2*64] = 1.0;
            mtx[2 + 3*64] = 1.0;
        }
        swr_set_matrix(mSwresCtx.get(), mtx.data(), 64);
    }
    else
        mSwresCtx.reset(swr_alloc_set_opts(nullptr,
            static_cast<int64_t>(mDstChanLayout), mDstSampleFmt, mCodecCtx->sample_rate,
            mCodecCtx->channel_layout ? static_cast<int64_t>(mCodecCtx->channel_layout)
                : av_get_default_channel_layout(mCodecCtx->channels),
            mCodecCtx->sample_fmt, mCodecCtx->sample_rate,
            0, nullptr));
    if(!mSwresCtx || swr_init(mSwresCtx.get()) != 0)
    {
        std::cerr<< "Failed to initialize audio converter" <<std::endl;
        goto finish;
    }

    alGenBuffers(static_cast<ALsizei>(mBuffers.size()), mBuffers.data());
    alGenSources(1, &mSource);

    if(DirectOutMode)
        alSourcei(mSource, AL_DIRECT_CHANNELS_SOFT, DirectOutMode);
    if(EnableWideStereo)
    {
        const float angles[2]{static_cast<float>(M_PI / 3.0), static_cast<float>(-M_PI / 3.0)};
        alSourcefv(mSource, AL_STEREO_ANGLES, angles);
    }
#ifdef AL_SOFT_bformat_ex
    if(has_bfmt_ex)
    {
        for(ALuint bufid : mBuffers)
        {
            alBufferi(bufid, AL_AMBISONIC_LAYOUT_SOFT, ambi_layout);
            alBufferi(bufid, AL_AMBISONIC_SCALING_SOFT, ambi_scale);
        }
    }
#endif

    if(alGetError() != AL_NO_ERROR)
        goto finish;

#ifdef AL_SOFT_callback_buffer
    if(alBufferCallbackSOFT)
    {
        alBufferCallbackSOFT(mBuffers[0], mFormat, mCodecCtx->sample_rate, bufferCallbackC, this,
            0);
        alSourcei(mSource, AL_BUFFER, static_cast<ALint>(mBuffers[0]));
        if(alGetError() != AL_NO_ERROR)
        {
            fprintf(stderr, "Failed to set buffer callback\n");
            alSourcei(mSource, AL_BUFFER, 0);
            buffer_len = static_cast<int>(duration_cast<seconds>(mCodecCtx->sample_rate *
                AudioBufferTime).count() * mFrameSize);
        }
        else
        {
            mBufferDataSize = static_cast<size_t>(duration_cast<seconds>(mCodecCtx->sample_rate *
                AudioBufferTotalTime).count()) * mFrameSize;
            mBufferData.reset(new uint8_t[mBufferDataSize]);
            mReadPos.store(0, std::memory_order_relaxed);
            mWritePos.store(0, std::memory_order_relaxed);

            ALCint refresh{};
            alcGetIntegerv(alcGetContextsDevice(alcGetCurrentContext()), ALC_REFRESH, 1, &refresh);
            sleep_time = milliseconds{seconds{1}} / refresh;
        }
    }
    else
#endif
        buffer_len = static_cast<int>(duration_cast<seconds>(mCodecCtx->sample_rate *
            AudioBufferTime).count() * mFrameSize);
    if(buffer_len > 0)
        samples = av_malloc(static_cast<ALuint>(buffer_len));

    /* Prefill the codec buffer. */
    do {
        const int ret{mPackets.sendTo(mCodecCtx.get())};
        if(ret == AVERROR(EAGAIN) || ret == AVErrorEOF)
            break;
    } while(1);

    srclock.lock();
    if(alcGetInteger64vSOFT)
    {
        int64_t devtime{};
        alcGetInteger64vSOFT(alcGetContextsDevice(alcGetCurrentContext()), ALC_DEVICE_CLOCK_SOFT,
            1, &devtime);
        mDeviceStartTime = nanoseconds{devtime} - mCurrentPts;
    }

    mSamplesLen = decodeFrame();
    if(mSamplesLen > 0)
    {
        mSamplesPos = std::min(mSamplesLen, getSync());

        auto skip = nanoseconds{seconds{mSamplesPos}} / mCodecCtx->sample_rate;
        mDeviceStartTime -= skip;
        mCurrentPts += skip;
    }

    while(!mMovie.mQuit.load(std::memory_order_relaxed)
        && mConnected.test_and_set(std::memory_order_relaxed))
    {
        ALenum state;
        if(mBufferDataSize > 0)
        {
            alGetSourcei(mSource, AL_SOURCE_STATE, &state);
            readAudio(getSync());
        }
        else
        {
            ALint processed, queued;

            /* First remove any processed buffers. */
            alGetSourcei(mSource, AL_BUFFERS_PROCESSED, &processed);
            while(processed > 0)
            {
                ALuint bid;
                alSourceUnqueueBuffers(mSource, 1, &bid);
                --processed;
            }

            /* Refill the buffer queue. */
            int sync_skip{getSync()};
            alGetSourcei(mSource, AL_BUFFERS_QUEUED, &queued);
            while(static_cast<ALuint>(queued) < mBuffers.size())
            {
                /* Read the next chunk of data, filling the buffer, and queue
                 * it on the source.
                 */
                const bool got_audio{readAudio(static_cast<uint8_t*>(samples),
                    static_cast<ALuint>(buffer_len), sync_skip)};
                if(!got_audio) break;

                const ALuint bufid{mBuffers[mBufferIdx]};
                mBufferIdx = static_cast<ALuint>((mBufferIdx+1) % mBuffers.size());

                alBufferData(bufid, mFormat, samples, buffer_len, mCodecCtx->sample_rate);
                alSourceQueueBuffers(mSource, 1, &bufid);
                ++queued;
            }

            /* Check that the source is playing. */
            alGetSourcei(mSource, AL_SOURCE_STATE, &state);
            if(state == AL_STOPPED)
            {
                /* AL_STOPPED means there was an underrun. Clear the buffer
                 * queue since this likely means we're late, and rewind the
                 * source to get it back into an AL_INITIAL state.
                 */
                alSourceRewind(mSource);
                alSourcei(mSource, AL_BUFFER, 0);
                if(alcGetInteger64vSOFT)
                {
                    /* Also update the device start time with the current
                     * device clock, so the decoder knows we're running behind.
                     */
                    int64_t devtime{};
                    alcGetInteger64vSOFT(alcGetContextsDevice(alcGetCurrentContext()),
                        ALC_DEVICE_CLOCK_SOFT, 1, &devtime);
                    mDeviceStartTime = nanoseconds{devtime} - mCurrentPts;
                }
                continue;
            }
        }

        /* (re)start the source if needed, and wait for a buffer to finish */
        if(state != AL_PLAYING && state != AL_PAUSED)
        {
            if(!startPlayback())
                break;
        }
        if(alGetError() != AL_NO_ERROR)
            return false;

        mSrcCond.wait_for(srclock, sleep_time);
    }

    alSourceRewind(mSource);
    alSourcei(mSource, AL_BUFFER, 0);
    srclock.unlock();

finish:
    av_freep(&samples);

#ifdef AL_SOFT_events
    if(alEventControlSOFT)
    {
        alEventControlSOFT(evt_types.size(), evt_types.data(), AL_FALSE);
        alEventCallbackSOFT(nullptr, nullptr);
    }
#endif

    return 0;
}